

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkFunctionReturns(CheckerVisitor *this,FunctionDecl *func)

{
  int32_t id;
  bool bVar1;
  uint uVar2;
  char *funcName;
  char *pcVar3;
  bool dummy;
  FunctionReturnTypeEvaluator local_30;
  
  if (this->effectsOnly != false) {
    return;
  }
  funcName = func->_name;
  if ((funcName == (char *)0x0) || (*funcName == '(')) {
    funcName = findSlotNameInStack(this,&func->super_Decl);
  }
  local_30.flags = 0;
  local_30.checker = this;
  uVar2 = FunctionReturnTypeEvaluator::compute(&local_30,(Statement *)func->_body,&dummy);
  if (((uVar2 & 0xfffffcf9) == 0) || (bVar1 = nameLooksLikeResultMustBeBoolean(funcName), !bVar1)) {
    bVar1 = false;
  }
  else {
    report(this,(Node *)func,0x5a,funcName);
    bVar1 = true;
  }
  if ((uVar2 & 0xef8) == 0 || (uVar2 & 1) == 0) {
    if (uVar2 == 0) {
      return;
    }
    if ((uVar2 & 0xfffff8fc & (uVar2 & 0xfffff8fc) - 1) == 0) {
      if ((funcName == (SQChar *)0x0 || bVar1) || (uVar2 & 1) == 0) {
        return;
      }
      bVar1 = nameLooksLikeResultMustBeBoolean(funcName);
      if ((!bVar1) &&
         (bVar1 = hasAnyPrefix(funcName,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)SQCompilationContext::
                                           function_should_return_something_prefix_abi_cxx11_),
         !bVar1)) {
        pcVar3 = strstr(funcName,"_ctor");
        if ((pcVar3 == (char *)0x0) && (pcVar3 = strstr(funcName,"Ctor"), pcVar3 == (char *)0x0)) {
          return;
        }
        if (((*funcName == 's') && (funcName[1] == 'e')) && (funcName[2] == 't')) {
          return;
        }
      }
      report(this,(Node *)func,0x67,funcName);
      return;
    }
    id = 0x4f;
  }
  else {
    if ((uVar2 >> 10 & 1) != 0) {
      return;
    }
    id = 0x4e;
  }
  report(this,(Node *)func,id);
  return;
}

Assistant:

void CheckerVisitor::checkFunctionReturns(FunctionDecl *func) {
  if (effectsOnly)
    return;

  const SQChar *name = func->name();

  if (!name || name[0] == '(') {
    name = findSlotNameInStack(func);
  }

  bool dummy;
  unsigned returnFlags = FunctionReturnTypeEvaluator(this).compute(func->body(), dummy);

  bool reported = false;

  if (returnFlags & ~(RT_BOOL | RT_UNRECOGNIZED | RT_FUNCTION_CALL | RT_NULL)) { // Null is castable to boolean
    if (nameLooksLikeResultMustBeBoolean(name)) {
      report(func, DiagnosticsId::DI_NAME_RET_BOOL, name);
      reported = true;
    }
  }

  if (!!(returnFlags & RT_NOTHING) &&
    !!(returnFlags & (RT_NUMBER | RT_STRING | RT_TABLE | RT_CLASS | RT_ARRAY | RT_CLOSURE | RT_UNRECOGNIZED | RT_THROW)))
  {
    if ((returnFlags & RT_THROW) == 0)
      report(func, DiagnosticsId::DI_NOT_ALL_PATH_RETURN_VALUE);
    reported = true;
  }
  else if (returnFlags)
  {
    unsigned flagsDiff = returnFlags & ~(RT_THROW | RT_NOTHING | RT_NULL | RT_UNRECOGNIZED | RT_FUNCTION_CALL);
    if (flagsDiff)
    {
      bool powerOfTwo = !(flagsDiff & (flagsDiff - 1));
      if (!powerOfTwo)
      {
        report(func, DiagnosticsId::DI_RETURNS_DIFFERENT_TYPES);
        reported = true;
      }
    }
  }

  if (!reported) {
    if (!!(returnFlags & RT_NOTHING) && nameLooksLikeFunctionMustReturnResult(name)) {
      report(func, DiagnosticsId::DI_NAME_EXPECTS_RETURN, name);
    }
  }
}